

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O1

void __thiscall
HostVector_iterators_and_ranges_Test::TestBody(HostVector_iterators_and_ranges_Test *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  void *__ptr;
  char *pcVar5;
  float sum;
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  float local_2c;
  AssertHelper local_28;
  internal local_20;
  undefined7 uStack_1f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  iVar2 = posix_memalign((void **)&local_20,8,400);
  if (iVar2 == 0) {
    __ptr = (void *)CONCAT71(uStack_1f,local_20);
  }
  else {
    __ptr = (void *)0x0;
  }
  uVar3 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)__ptr + uVar3 + 4) = 0x40400000;
    uVar3 = uVar3 + 4;
  } while (uVar3 < 0x18c);
  lVar4 = 0;
  do {
    *(undefined4 *)((long)__ptr + lVar4) = 0x40400000;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  local_2c = 0.0;
  lVar4 = 0;
  do {
    local_2c = local_2c + *(float *)((long)__ptr + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  local_38.ptr_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<float,float>
            (&local_20,"float(3*100)","sum",(float *)&local_38,&local_2c);
  if (local_20 == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar4 = 0;
  do {
    *(float *)((long)__ptr + lVar4) = *(float *)((long)__ptr + lVar4) + 1.0;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  local_2c = 0.0;
  lVar4 = 0;
  do {
    local_2c = local_2c + *(float *)((long)__ptr + lVar4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 400);
  local_38.ptr_._0_4_ = 0x43c80000;
  testing::internal::CmpHelperEQ<float,float>
            (&local_20,"float(4*100)","sum",(float *)&local_38,&local_2c);
  if (local_20 == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x97,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(HostVector, iterators_and_ranges) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // check that begin()/end() iterators work
    for(auto it=v1.begin(); it<v1.end(); ++it)
        *it = float(3.0);

    // check that range based for loop works
    for(auto &val : v1)
        val = float(3.0);
    {
        float sum = 0;
        // check it works for const
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(3*100), sum);
    }

    // check that std::for_each works
    std::for_each(v1.begin(), v1.end(), [] (float& val) {val+=1;}); // add 1 to every value in v1
    {
        float sum = 0;
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(4*100), sum);
    }
}